

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

void __thiscall QAuthenticator::setUser(QAuthenticator *this,QString *user)

{
  bool bVar1;
  
  if (this->d != (QAuthenticatorPrivate *)0x0) {
    bVar1 = operator!=(&this->d->user,user);
    if (!bVar1) {
      return;
    }
  }
  detach(this);
  QString::operator=(&this->d->user,(QString *)user);
  QAuthenticatorPrivate::updateCredentials(this->d);
  return;
}

Assistant:

void QAuthenticator::setUser(const QString &user)
{
    if (!d || d->user != user) {
        detach();
        d->user = user;
        d->updateCredentials();
    }
}